

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_SWARM(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam;
  int iVar2;
  source sVar3;
  source origin;
  loc target;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  iVar2 = (context->value).m_bonus;
  target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[context->dir]);
  if ((context->dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
    target_get((loc_conflict *)&target);
  }
  for (; iVar2 != 0; iVar2 = iVar2 + -1) {
    sVar3 = source_player();
    origin._4_4_ = 0;
    origin.what = sVar3.what;
    origin.which.trap = sVar3.which.trap;
    _Var1 = project(origin,context->radius,target,dam,context->subtype,L'|',L'\0','\0',context->obj)
    ;
    if (_Var1) {
      context->ident = true;
    }
  }
  return true;
}

Assistant:

bool effect_handler_SWARM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int num = context->value.m_bonus;

	struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

	int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Ask for a target if no direction given (early detonation) */
	if ((context->dir == DIR_TARGET) && target_okay()) {
		target_get(&target);
	}

	while (num--) {
		/* Aim at the target.  Hurt items on floor. */
		if (project(source_player(), context->radius, target, dam,
					context->subtype, flg, 0, 0, context->obj))
			context->ident = true;
	}

	return true;
}